

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
AnalyzeClassDefinition
          (ExpressionContext *ctx,SynClassDefinition *syntax,TypeGenericClassProto *proto,
          IntrusiveList<TypeHandle> generics)

{
  ScopeData **ppSVar1;
  uint uniqueId;
  long lVar2;
  ExprBase *pEVar3;
  IntrusiveList<MatchData> generics_00;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint offset;
  char *pcVar7;
  TypeClass *pTVar8;
  ScopeData *pSVar9;
  TypeBase *pTVar10;
  TypeClass *pTVar11;
  MatchData *pMVar12;
  AliasData *pAVar13;
  undefined4 extraout_var_02;
  ExprClassDefinition *classDefinition;
  undefined4 extraout_var_04;
  SynIdentifier *pSVar14;
  VariableData *this;
  MemberHandle *node;
  undefined4 extraout_var_08;
  MatchData *node_00;
  ConstantData *node_01;
  undefined4 extraout_var_11;
  int iVar15;
  TypeHandle *pTVar16;
  Node *pNVar17;
  TypeHandle *pTVar18;
  char *pcVar19;
  bool bVar20;
  uint uVar21;
  ulong uVar22;
  SynIdentifier *pSVar23;
  TypeClass *baseClass;
  ConstantData *pCVar24;
  InplaceStr IVar25;
  IntrusiveList<MatchData> actualGenerics;
  TraceScope traceScope;
  IntrusiveList<MatchData> local_a8;
  TraceScope local_90;
  SynIdentifier local_80;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  
  IVar25.end = generics.tail;
  pTVar16 = generics.head;
  IVar25.begin = (syntax->name->name).end;
  anon_unknown.dwarf_c6b42::CheckTypeConflict
            ((anon_unknown_dwarf_c6b42 *)ctx,(ExpressionContext *)syntax,
             (SynBase *)(syntax->name->name).begin,IVar25);
  IVar25 = GetTypeNameInScope(ctx,ctx->scope,syntax->name->name);
  pcVar7 = IVar25.begin;
  if ((AnalyzeClassDefinition(ExpressionContext&,SynClassDefinition*,TypeGenericClassProto*,IntrusiveList<TypeHandle>)
       ::token == '\0') &&
     (iVar5 = __cxa_guard_acquire(&AnalyzeClassDefinition(ExpressionContext&,SynClassDefinition*,TypeGenericClassProto*,IntrusiveList<TypeHandle>)
                                   ::token), iVar5 != 0)) {
    AnalyzeClassDefinition::token = NULLC::TraceGetToken("analyze","AnalyzeClassDefinition");
    __cxa_guard_release(&AnalyzeClassDefinition(ExpressionContext&,SynClassDefinition*,TypeGenericClassProto*,IntrusiveList<TypeHandle>)
                         ::token);
  }
  NULLC::TraceScope::TraceScope(&local_90,AnalyzeClassDefinition::token);
  lVar4 = NULLC::traceContext;
  uVar22 = (long)IVar25.end - (long)pcVar7;
  iVar5 = (int)uVar22;
  if (iVar5 != 0) {
    uVar21 = iVar5 + 1;
    if ((*(uint *)(NULLC::traceContext + 0x264) <= *(int *)(NULLC::traceContext + 0x260) + uVar21)
       || (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
    }
    if (*(uint *)(lVar4 + 0x264) <= uVar21) {
      __assert_fail("count + 1 < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
    }
    uVar6 = *(uint *)(lVar4 + 0x260);
    memcpy((void *)((ulong)uVar6 + *(long *)(lVar4 + 0x268)),pcVar7,uVar22 & 0xffffffff);
    *(undefined1 *)(*(long *)(lVar4 + 0x268) + (ulong)(uint)(*(int *)(lVar4 + 0x260) + iVar5)) = 0;
    *(int *)(lVar4 + 0x260) = *(int *)(lVar4 + 0x260) + uVar21;
    lVar2 = *(long *)(lVar4 + 0x278);
    uVar21 = *(uint *)(lVar4 + 0x270);
    *(uint *)(lVar4 + 0x270) = uVar21 + 1;
    *(uint *)(lVar2 + (ulong)uVar21 * 8) = uVar6 * 4 + 2;
    *(undefined4 *)(lVar2 + 4 + (ulong)uVar21 * 8) = 0;
  }
  ppSVar1 = &ctx->scope;
  if ((proto == (TypeGenericClassProto *)0x0) &&
     (pSVar14 = (syntax->aliases).head, pSVar14 != (SynIdentifier *)0x0)) {
    do {
      uVar21 = NULLC::GetStringHash((pSVar14->name).begin,(pSVar14->name).end);
      pTVar10 = anon_unknown.dwarf_c6b42::LookupTypeByName(ctx,uVar21);
      if (pTVar10 != (TypeBase *)0x0) {
        anon_unknown.dwarf_c6b42::Stop
                  (ctx,&pSVar14->super_SynBase,
                   "ERROR: there is already a type or an alias with the same name");
      }
      pSVar23 = (syntax->aliases).head;
      if (pSVar23 != pSVar14 && pSVar23 != (SynIdentifier *)0x0) {
        do {
          bVar20 = InplaceStr::operator==(&pSVar23->name,&pSVar14->name);
          if (bVar20) {
            anon_unknown.dwarf_c6b42::Stop
                      (ctx,&pSVar14->super_SynBase,
                       "ERROR: there is already a type or an alias with the same name");
          }
          pSVar23 = (SynIdentifier *)(pSVar23->super_SynBase).next;
          if ((pSVar23 == (SynIdentifier *)0x0) || ((pSVar23->super_SynBase).typeID != 4)) {
            pSVar23 = (SynIdentifier *)0x0;
          }
        } while ((pSVar23 != (SynIdentifier *)0x0) && (pSVar23 != pSVar14));
      }
      pSVar14 = (SynIdentifier *)(pSVar14->super_SynBase).next;
      if ((pSVar14 == (SynIdentifier *)0x0) || ((pSVar14->super_SynBase).typeID != 4)) {
        pSVar14 = (SynIdentifier *)0x0;
      }
    } while (pSVar14 != (SynIdentifier *)0x0);
    uVar21 = NULLC::GetStringHash(pcVar7,IVar25.end);
    pTVar10 = anon_unknown.dwarf_c6b42::LookupTypeByName(ctx,uVar21);
    if (pTVar10 != (TypeBase *)0x0) {
      pcVar19 = "ERROR: \'%.*s\' is being redefined";
      if (pTVar10->typeID == 0x18) {
        pcVar19 = "ERROR: type \'%.*s\' was forward declared as a non-generic type";
      }
      anon_unknown.dwarf_c6b42::Stop(ctx,&syntax->super_SynBase,pcVar19,uVar22 & 0xffffffff,pcVar7);
    }
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xd8);
    pTVar11 = (TypeClass *)CONCAT44(extraout_var,iVar5);
    local_80.super_SynBase.begin = (syntax->name->super_SynBase).begin;
    local_80.super_SynBase.end = (syntax->name->super_SynBase).end;
    local_80.super_SynBase.typeID = 4;
    if (local_80.super_SynBase.begin == (Lexeme *)0x0) {
      local_80.super_SynBase.pos.begin = (char *)0x0;
    }
    else {
      local_80.super_SynBase.pos.begin = (local_80.super_SynBase.begin)->pos;
    }
    if (local_80.super_SynBase.end == (Lexeme *)0x0) {
      local_80.super_SynBase.pos.end = (char *)0x0;
    }
    else {
      local_80.super_SynBase.pos.end =
           (local_80.super_SynBase.end)->pos + (local_80.super_SynBase.end)->length;
    }
    if (local_80.super_SynBase.pos.end < local_80.super_SynBase.pos.begin) goto LAB_0016bbd8;
    local_80.super_SynBase.next = (SynBase *)0x0;
    local_80.super_SynBase.listed = false;
    local_80.super_SynBase.isInternal = false;
    local_80.super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
    local_80.name = IVar25;
    TypeGenericClassProto::TypeGenericClassProto
              ((TypeGenericClassProto *)pTVar11,&local_80,&syntax->super_SynBase,*ppSVar1,syntax);
    ExpressionContext::AddType(ctx,(TypeBase *)pTVar11);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    classDefinition = (ExprClassDefinition *)CONCAT44(extraout_var_11,iVar5);
    pTVar10 = ctx->typeVoid;
    (classDefinition->super_ExprBase).typeID = 0x2c;
    (classDefinition->super_ExprBase).source = &syntax->super_SynBase;
    (classDefinition->super_ExprBase).type = pTVar10;
    (classDefinition->super_ExprBase).next = (ExprBase *)0x0;
    (classDefinition->super_ExprBase).listed = false;
    (classDefinition->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00249148;
    classDefinition->classType = pTVar11;
    goto LAB_0016ba7e;
  }
  iVar5 = 0;
  iVar15 = 0;
  if (pTVar16 != (TypeHandle *)0x0) {
    iVar15 = 0;
    pTVar18 = pTVar16;
    do {
      iVar15 = iVar15 + 1;
      pTVar18 = pTVar18->next;
    } while (pTVar18 != (TypeHandle *)0x0);
  }
  pSVar14 = (syntax->aliases).head;
  if (pSVar14 != (SynIdentifier *)0x0) {
    iVar5 = 0;
    do {
      iVar5 = iVar5 + 1;
      pSVar14 = (SynIdentifier *)(pSVar14->super_SynBase).next;
    } while (pSVar14 != (SynIdentifier *)0x0);
  }
  if (iVar15 != iVar5) {
    __assert_fail("generics.size() == syntax->aliases.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x29ba,
                  "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                 );
  }
  if (pTVar16 != (TypeHandle *)0x0) {
    IVar25 = GetGenericClassTypeName(ctx,&proto->super_TypeBase,generics);
  }
  pcVar7 = IVar25.end;
  pcVar19 = IVar25.begin;
  uVar21 = (int)IVar25.end - (int)IVar25.begin;
  if (0x2000 < uVar21) {
    anon_unknown.dwarf_c6b42::Stop
              (ctx,&syntax->super_SynBase,
               "ERROR: generated type name exceeds maximum type length \'%d\'",0x2000);
  }
  uVar6 = NULLC::GetStringHash(pcVar19,pcVar7);
  pTVar8 = (TypeClass *)anon_unknown.dwarf_c6b42::LookupTypeByName(ctx,uVar6);
  pTVar11 = (TypeClass *)0x0;
  if (pTVar8 != (TypeClass *)0x0) {
    if ((pTVar8->super_TypeStruct).super_TypeBase.typeID == 0x18) {
      pTVar11 = pTVar8;
    }
    if ((pTVar11 == (TypeClass *)0x0) ||
       (pSVar9 = (ScopeData *)ppSVar1, pTVar11->completed != false)) {
      anon_unknown.dwarf_c6b42::Stop
                (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",(ulong)uVar21,
                 pcVar19);
    }
    while (pSVar9 = pSVar9->scope, pSVar9 != (ScopeData *)0x0) {
      if ((TypeClass *)pSVar9->ownerType == pTVar11) {
        anon_unknown.dwarf_c6b42::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",(ulong)uVar21,
                   pcVar19);
      }
    }
  }
  if (pTVar16 != (TypeHandle *)0x0) {
    uVar21 = NULLC::GetStringHash(pcVar19,pcVar7);
    for (pNVar17 = (ctx->genericTypeMap).entries[uVar21 & 0x3ff]; pNVar17 != (Node *)0x0;
        pNVar17 = pNVar17->next) {
      if (pNVar17->hash == uVar21) {
        __assert_fail("ctx.genericTypeMap.find(className.hash()) == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x29d7,
                      "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                     );
      }
    }
  }
  if (syntax->align == (SynAlign *)0x0) {
    uVar21 = 0;
  }
  else {
    uVar21 = AnalyzeAlignment(ctx,syntax->align);
  }
  local_a8.head = (MatchData *)0x0;
  local_a8.tail = (MatchData *)0x0;
  pSVar14 = (syntax->aliases).head;
  if (pSVar14 != (SynIdentifier *)0x0 && pTVar16 != (TypeHandle *)0x0) {
    pTVar18 = pTVar16;
    do {
      if ((pTVar18->type != (TypeBase *)0x0) && (pTVar18->type->typeID == 0)) {
        __assert_fail("!isType<TypeError>(currType->type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x29e4,
                      "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                     );
      }
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pMVar12 = (MatchData *)CONCAT44(extraout_var_00,iVar5);
      pTVar10 = pTVar18->type;
      pMVar12->name = pSVar14;
      pMVar12->type = pTVar10;
      pMVar12->next = (MatchData *)0x0;
      pMVar12->listed = false;
      IntrusiveList<MatchData>::push_back(&local_a8,pMVar12);
      pSVar14 = (SynIdentifier *)(pSVar14->super_SynBase).next;
      if ((pSVar14 == (SynIdentifier *)0x0) || ((pSVar14->super_SynBase).typeID != 4)) {
        pSVar14 = (SynIdentifier *)0x0;
      }
      pTVar18 = pTVar18->next;
    } while ((pTVar18 != (TypeHandle *)0x0) && (pSVar14 != (SynIdentifier *)0x0));
  }
  if (syntax->baseClass == (SynBase *)0x0) {
LAB_0016b4f9:
    baseClass = (TypeClass *)0x0;
  }
  else {
    ExpressionContext::PushTemporaryScope(ctx);
    for (pMVar12 = local_a8.head; pMVar12 != (MatchData *)0x0; pMVar12 = pMVar12->next) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pAVar13 = (AliasData *)CONCAT44(extraout_var_01,iVar5);
      pSVar9 = ctx->scope;
      pSVar14 = pMVar12->name;
      pTVar10 = pMVar12->type;
      uVar6 = ctx->uniqueAliasId;
      ctx->uniqueAliasId = uVar6 + 1;
      pAVar13->source = &syntax->super_SynBase;
      pAVar13->scope = pSVar9;
      pAVar13->type = pTVar10;
      pAVar13->name = pSVar14;
      pAVar13->uniqueId = uVar6;
      pAVar13->importModule = (ModuleData *)0x0;
      uVar6 = NULLC::GetStringHash((pSVar14->name).begin,(pSVar14->name).end);
      pAVar13->nameHash = uVar6;
      ExpressionContext::AddAlias(ctx,pAVar13);
    }
    pTVar8 = (TypeClass *)AnalyzeType(ctx,syntax->baseClass,true,(bool *)0x0);
    ExpressionContext::PopScope(ctx,SCOPE_TEMPORARY,true);
    if (pTVar8 == (TypeClass *)0x0) {
LAB_0016b4c6:
      baseClass = (TypeClass *)0x0;
    }
    else {
      if ((pTVar8->super_TypeStruct).super_TypeBase.typeID == 0) goto LAB_0016b4f9;
      if ((pTVar8 == (TypeClass *)0x0) ||
         (baseClass = pTVar8, (pTVar8->super_TypeStruct).super_TypeBase.typeID != 0x18))
      goto LAB_0016b4c6;
    }
    if ((baseClass == (TypeClass *)0x0) || (baseClass->extendable == false)) {
      anon_unknown.dwarf_c6b42::Stop
                (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not extendable",
                 (ulong)(uint)(*(int *)&(pTVar8->super_TypeStruct).super_TypeBase.name.end -
                              (int)(pTVar8->super_TypeStruct).super_TypeBase.name.begin));
    }
  }
  bVar20 = (bool)(baseClass != (TypeClass *)0x0 | syntax->extendable);
  if (pTVar11 == (TypeClass *)0x0) {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
    pTVar11 = (TypeClass *)CONCAT44(extraout_var_02,iVar5);
    local_80.super_SynBase.begin = (syntax->name->super_SynBase).begin;
    local_80.super_SynBase.end = (syntax->name->super_SynBase).end;
    local_80.super_SynBase.typeID = 4;
    if (local_80.super_SynBase.begin == (Lexeme *)0x0) {
      local_80.super_SynBase.pos.begin = (char *)0x0;
    }
    else {
      local_80.super_SynBase.pos.begin = (local_80.super_SynBase.begin)->pos;
    }
    if (local_80.super_SynBase.end == (Lexeme *)0x0) {
      local_80.super_SynBase.pos.end = (char *)0x0;
    }
    else {
      local_80.super_SynBase.pos.end =
           (local_80.super_SynBase.end)->pos + (local_80.super_SynBase.end)->length;
    }
    if (local_80.super_SynBase.pos.end < local_80.super_SynBase.pos.begin) {
LAB_0016bbd8:
      local_80.super_SynBase.typeID = 4;
      local_80.super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_002470e8;
      __assert_fail("strEnd >= strBegin",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                    ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
    }
    local_80.super_SynBase.next = (SynBase *)0x0;
    local_80.super_SynBase.listed = false;
    local_80.super_SynBase.isInternal = false;
    local_80.super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
    generics_00.tail._0_4_ = (int)local_a8.tail;
    generics_00.head = local_a8.head;
    generics_00.tail._4_4_ = (int)((ulong)local_a8.tail >> 0x20);
    local_80.name = IVar25;
    TypeClass::TypeClass
              (pTVar11,ctx->allocator,&local_80,&syntax->super_SynBase,*ppSVar1,proto,generics_00,
               bVar20,baseClass);
    ExpressionContext::AddType(ctx,(TypeBase *)pTVar11);
  }
  else {
    pTVar11->extendable = bVar20;
    pTVar11->baseClass = baseClass;
  }
  if (pTVar16 != (TypeHandle *)0x0) {
    uVar6 = NULLC::GetStringHash(pcVar19,pcVar7);
    HashMap<TypeClass_*>::insert(&ctx->genericTypeMap,uVar6,pTVar11);
  }
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
  classDefinition = (ExprClassDefinition *)CONCAT44(extraout_var_03,iVar5);
  pTVar10 = ctx->typeVoid;
  (classDefinition->super_ExprBase).typeID = 0x2d;
  (classDefinition->super_ExprBase).source = &syntax->super_SynBase;
  (classDefinition->super_ExprBase).type = pTVar10;
  (classDefinition->super_ExprBase).next = (ExprBase *)0x0;
  (classDefinition->super_ExprBase).listed = false;
  (classDefinition->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00249180;
  classDefinition->classType = pTVar11;
  (classDefinition->aliases).head = (ExprAliasDefinition *)0x0;
  (classDefinition->aliases).tail = (ExprAliasDefinition *)0x0;
  (classDefinition->functions).head = (ExprBase *)0x0;
  (classDefinition->functions).tail = (ExprBase *)0x0;
  ExpressionContext::PushScope(ctx,(TypeBase *)pTVar11);
  (pTVar11->super_TypeStruct).typeScope = *ppSVar1;
  for (pMVar12 = (pTVar11->generics).head; pMVar12 != (MatchData *)0x0; pMVar12 = pMVar12->next) {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pAVar13 = (AliasData *)CONCAT44(extraout_var_04,iVar5);
    pSVar9 = ctx->scope;
    pSVar14 = pMVar12->name;
    pTVar10 = pMVar12->type;
    uVar6 = ctx->uniqueAliasId;
    ctx->uniqueAliasId = uVar6 + 1;
    pAVar13->source = &syntax->super_SynBase;
    pAVar13->scope = pSVar9;
    pAVar13->type = pTVar10;
    pAVar13->name = pSVar14;
    pAVar13->uniqueId = uVar6;
    pAVar13->importModule = (ModuleData *)0x0;
    uVar6 = NULLC::GetStringHash((pSVar14->name).begin,(pSVar14->name).end);
    pAVar13->nameHash = uVar6;
    ExpressionContext::AddAlias(ctx,pAVar13);
  }
  if (bVar20 != false) {
    offset = anon_unknown.dwarf_c6b42::AllocateVariableInScope
                       (ctx,&syntax->super_SynBase,ctx->typeTypeID->alignment,ctx->typeTypeID);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar14 = (SynIdentifier *)CONCAT44(extraout_var_05,iVar5);
    (pSVar14->super_SynBase).typeID = 4;
    (pSVar14->super_SynBase).begin = (Lexeme *)0x0;
    (pSVar14->super_SynBase).end = (Lexeme *)0x0;
    (pSVar14->super_SynBase).pos.begin = (char *)0x0;
    (pSVar14->super_SynBase).pos.end = (char *)0x0;
    *(undefined8 *)((long)&(pSVar14->super_SynBase).pos.end + 2) = 0;
    *(undefined8 *)((long)&(pSVar14->super_SynBase).next + 2) = 0;
    (pSVar14->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
    (pSVar14->name).begin = "$typeid";
    (pSVar14->name).end = "";
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    this = (VariableData *)CONCAT44(extraout_var_06,iVar5);
    uVar6 = ctx->typeTypeID->alignment;
    uniqueId = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData
              (this,ctx->allocator,&syntax->super_SynBase,ctx->scope,uVar6,ctx->typeTypeID,pSVar14,
               offset,uniqueId);
    ExpressionContext::AddVariable(ctx,this,false);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    node = (MemberHandle *)CONCAT44(extraout_var_07,iVar5);
    node->source = (SynBase *)0x0;
    node->variable = this;
    node->initializer = (SynBase *)0x0;
    node->next = (MemberHandle *)0x0;
    node->listed = false;
    IntrusiveList<MemberHandle>::push_back(&(pTVar11->super_TypeStruct).members,node);
  }
  if (baseClass != (TypeClass *)0x0) {
    (pTVar11->super_TypeStruct).super_TypeBase.alignment =
         (baseClass->super_TypeStruct).super_TypeBase.alignment;
    pMVar12 = (baseClass->aliases).head;
    if (pMVar12 != (MatchData *)0x0) {
      do {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pAVar13 = (AliasData *)CONCAT44(extraout_var_08,iVar5);
        pSVar9 = ctx->scope;
        pSVar14 = pMVar12->name;
        pTVar10 = pMVar12->type;
        uVar6 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar6 + 1;
        pAVar13->source = &syntax->super_SynBase;
        pAVar13->scope = pSVar9;
        pAVar13->type = pTVar10;
        pAVar13->name = pSVar14;
        pAVar13->uniqueId = uVar6;
        pAVar13->importModule = (ModuleData *)0x0;
        uVar6 = NULLC::GetStringHash((pSVar14->name).begin,(pSVar14->name).end);
        pAVar13->nameHash = uVar6;
        ExpressionContext::AddAlias(ctx,pAVar13);
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        node_00 = (MatchData *)CONCAT44(extraout_var_09,iVar5);
        pSVar14 = pMVar12->name;
        pTVar10 = pMVar12->type;
        node_00->name = pSVar14;
        node_00->type = pTVar10;
        node_00->next = (MatchData *)0x0;
        node_00->listed = false;
        if (pSVar14 == (SynIdentifier *)0x0) {
          __assert_fail("name",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                        ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
        }
        IntrusiveList<MatchData>::push_back(&pTVar11->aliases,node_00);
        pMVar12 = pMVar12->next;
      } while (pMVar12 != (MatchData *)0x0);
    }
    AddBaseClassMemberVariables(ctx,&syntax->super_SynBase,baseClass,pTVar11);
    pCVar24 = (baseClass->super_TypeStruct).constants.head;
    if (pCVar24 != (ConstantData *)0x0) {
      do {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        node_01 = (ConstantData *)CONCAT44(extraout_var_10,iVar5);
        pEVar3 = pCVar24->value;
        node_01->name = pCVar24->name;
        node_01->value = pEVar3;
        node_01->next = (ConstantData *)0x0;
        node_01->listed = false;
        IntrusiveList<ConstantData>::push_back(&(pTVar11->super_TypeStruct).constants,node_01);
        pCVar24 = pCVar24->next;
      } while (pCVar24 != (ConstantData *)0x0);
    }
    anon_unknown.dwarf_c6b42::FinalizeAlignment(&pTVar11->super_TypeStruct);
    if ((pTVar11->super_TypeStruct).super_TypeBase.size !=
        (baseClass->super_TypeStruct).super_TypeBase.size) {
      __assert_fail("classType->size == baseClass->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x2a43,
                    "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                   );
    }
  }
  if (syntax->align != (SynAlign *)0x0) {
    (pTVar11->super_TypeStruct).super_TypeBase.alignment = uVar21;
  }
  AnalyzeClassElements(ctx,classDefinition,syntax->elements);
  ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
LAB_0016ba7e:
  NULLC::TraceScope::~TraceScope(&local_90);
  return &classDefinition->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeClassDefinition(ExpressionContext &ctx, SynClassDefinition *syntax, TypeGenericClassProto *proto, IntrusiveList<TypeHandle> generics)
{
	CheckTypeConflict(ctx, syntax, syntax->name->name);

	InplaceStr typeName = GetTypeNameInScope(ctx, ctx.scope, syntax->name->name);

	TRACE_SCOPE("analyze", "AnalyzeClassDefinition");
	TRACE_LABEL2(typeName.begin, typeName.end);

	if(!proto && !syntax->aliases.empty())
	{
		for(SynIdentifier *curr = syntax->aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
		{
			if(LookupTypeByName(ctx, curr->name.hash()))
				Stop(ctx, curr, "ERROR: there is already a type or an alias with the same name");

			for(SynIdentifier *prev = syntax->aliases.head; prev && prev != curr; prev = getType<SynIdentifier>(prev->next))
			{
				if(prev->name == curr->name)
					Stop(ctx, curr, "ERROR: there is already a type or an alias with the same name");
			}
		}

		if(TypeBase *type = LookupTypeByName(ctx, typeName.hash()))
		{
			TypeClass *originalDefinition = getType<TypeClass>(type);

			if(originalDefinition)
				Stop(ctx, syntax, "ERROR: type '%.*s' was forward declared as a non-generic type", FMT_ISTR(typeName));
			else
				Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(typeName));
		}

		TypeGenericClassProto *genericProtoType = new (ctx.get<TypeGenericClassProto>()) TypeGenericClassProto(SynIdentifier(syntax->name, typeName), syntax, ctx.scope, syntax);

		ctx.AddType(genericProtoType);

		return new (ctx.get<ExprGenericClassPrototype>()) ExprGenericClassPrototype(syntax, ctx.typeVoid, genericProtoType);
	}

	assert(generics.size() == syntax->aliases.size());

	InplaceStr className = generics.empty() ? typeName : GetGenericClassTypeName(ctx, proto, generics);

	if(className.length() > NULLC_MAX_TYPE_NAME_LENGTH)
		Stop(ctx, syntax, "ERROR: generated type name exceeds maximum type length '%d'", NULLC_MAX_TYPE_NAME_LENGTH);

	TypeClass *originalDefinition = NULL;

	if(TypeBase *type = LookupTypeByName(ctx, className.hash()))
	{
		originalDefinition = getType<TypeClass>(type);

		if(!originalDefinition)
			Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(className));

		if(originalDefinition->completed)
			Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(className));

		for(ScopeData *scope = ctx.scope; scope; scope = scope->scope)
		{
			if(scope->ownerType == originalDefinition)
				Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(className));
		}
	}

	if(!generics.empty())
	{
		// Check if type already exists
		assert(ctx.genericTypeMap.find(className.hash()) == NULL);
	}

	unsigned alignment = syntax->align ? AnalyzeAlignment(ctx, syntax->align) : 0;

	IntrusiveList<MatchData> actualGenerics;

	{
		TypeHandle *currType = generics.head;
		SynIdentifier *currName = syntax->aliases.head;

		while(currType && currName)
		{
			assert(!isType<TypeError>(currType->type));

			actualGenerics.push_back(new (ctx.get<MatchData>()) MatchData(currName, currType->type));

			currType = currType->next;
			currName = getType<SynIdentifier>(currName->next);
		}
	}

	TypeClass *baseClass = NULL;

	if(syntax->baseClass)
	{
		ctx.PushTemporaryScope();

		for(MatchData *el = actualGenerics.head; el; el = el->next)
			ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

		TypeBase *type = AnalyzeType(ctx, syntax->baseClass);

		ctx.PopScope(SCOPE_TEMPORARY);

		if(!isType<TypeError>(type))
		{
			baseClass = getType<TypeClass>(type);

			if(!baseClass || !baseClass->extendable)
				Stop(ctx, syntax, "ERROR: type '%.*s' is not extendable", FMT_ISTR(type->name));
		}
	}
	
	bool extendable = syntax->extendable || baseClass;

	TypeClass *classType = NULL;
	
	if(originalDefinition)
	{
		classType = originalDefinition;

		classType->extendable = extendable;
		classType->baseClass = baseClass;
	}
	else
	{
		classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, SynIdentifier(syntax->name, className), syntax, ctx.scope, proto, actualGenerics, extendable, baseClass);

		ctx.AddType(classType);
	}

	if(!generics.empty())
		ctx.genericTypeMap.insert(className.hash(), classType);

	ExprClassDefinition *classDefinition = new (ctx.get<ExprClassDefinition>()) ExprClassDefinition(syntax, ctx.typeVoid, classType);

	ctx.PushScope(classType);

	classType->typeScope = ctx.scope;

	for(MatchData *el = classType->generics.head; el; el = el->next)
		ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

	// Base class adds a typeid member
	if(extendable)
	{
		unsigned offset = AllocateVariableInScope(ctx, syntax, ctx.typeTypeID->alignment, ctx.typeTypeID);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$typeid"));

		VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, ctx.typeTypeID->alignment, ctx.typeTypeID, nameIdentifier, offset, ctx.uniqueVariableId++);

		ctx.AddVariable(member, false);

		classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, member, NULL));
	}

	if(baseClass)
	{
		// Use base class alignment at ths point to match member locations
		classType->alignment = baseClass->alignment;

		// Add members of base class
		for(MatchData *el = baseClass->aliases.head; el; el = el->next)
		{
			ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

			classType->aliases.push_back(new (ctx.get<MatchData>()) MatchData(el->name, el->type));
		}

		AddBaseClassMemberVariables(ctx, syntax, baseClass, classType);

		for(ConstantData *el = baseClass->constants.head; el; el = el->next)
			classType->constants.push_back(new (ctx.get<ConstantData>()) ConstantData(el->name, el->value));

		FinalizeAlignment(classType);

		assert(classType->size == baseClass->size);
	}

	if(syntax->align)
		classType->alignment = alignment;

	AnalyzeClassElements(ctx, classDefinition, syntax->elements);

	ctx.PopScope(SCOPE_TYPE);

	return classDefinition;
}